

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O1

bool ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  ostream *poVar1;
  ostream *poVar2;
  ostream *poVar3;
  int iVar4;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *pCVar5;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  size_t total_matches;
  
  iVar4 = ClownLZSS_FindOptimalMatches
                    (-1,0x108,0x2000,
                     (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)0x0,9,
                     GetMatchCost,data,1,data_size,(ClownLZSS_Match **)&descriptor_bits,
                     &total_matches,(void *)0x0);
  if (iVar4 != 0) {
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::DescriptorFieldWriter(&descriptor_bits,output);
    pCVar5 = descriptor_bits.
             super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
             .output;
    if (total_matches != 0) {
      do {
        poVar1 = (pCVar5->
                 super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 ).output;
        poVar2 = pCVar5[1].
                 super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 .output;
        if (poVar1 == poVar2 + 1) {
          if (descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits_remaining == 0) {
            BitField::
            DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
            ::WriteBitsImplementation(&descriptor_bits);
          }
          descriptor_bits.
          super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          .bits = descriptor_bits.
                  super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  .bits * 2 + 1;
          descriptor_bits.
          super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          .bits_remaining =
               descriptor_bits.
               super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
               .bits_remaining - 1;
          std::ostream::put((char)(output->
                                  super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                  ).output);
        }
        else {
          poVar3 = pCVar5[2].
                   super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   .output;
          if ((ulong)((long)poVar2 - (long)poVar1) < 0x101 && poVar3 + -2 < (ostream *)0x4) {
            if (descriptor_bits.
                super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                .bits_remaining == 0) {
              BitField::
              DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
              ::WriteBitsImplementation(&descriptor_bits);
            }
            descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits = descriptor_bits.
                    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    .bits << 1;
            descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits_remaining =
                 descriptor_bits.
                 super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                 .bits_remaining - 1;
            if (descriptor_bits.
                super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                .bits_remaining == 0) {
              BitField::
              DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
              ::WriteBitsImplementation(&descriptor_bits);
            }
            descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits = descriptor_bits.
                    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    .bits << 1;
            descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits_remaining =
                 descriptor_bits.
                 super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                 .bits_remaining - 1;
            std::ostream::put((char)(output->
                                    super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                    ).output);
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push(&descriptor_bits.
                    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   ,((ulong)poVar3 & 2) == 0);
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push(&descriptor_bits.
                    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   ,(bool)((byte)poVar3 & 1));
          }
          else {
            if (poVar3 + -3 < (ostream *)0x7) {
              if (descriptor_bits.
                  super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  .bits_remaining == 0) {
                BitField::
                DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                ::WriteBitsImplementation(&descriptor_bits);
              }
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits = descriptor_bits.
                      super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                      .bits << 1;
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits_remaining =
                   descriptor_bits.
                   super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   .bits_remaining - 1;
              if (descriptor_bits.
                  super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  .bits_remaining == 0) {
                BitField::
                DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                ::WriteBitsImplementation(&descriptor_bits);
              }
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits = descriptor_bits.
                      super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                      .bits * 2 + 1;
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits_remaining =
                   descriptor_bits.
                   super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   .bits_remaining - 1;
              std::ostream::put((char)(output->
                                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                      ).output);
            }
            else {
              if (descriptor_bits.
                  super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  .bits_remaining == 0) {
                BitField::
                DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                ::WriteBitsImplementation(&descriptor_bits);
              }
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits = descriptor_bits.
                      super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                      .bits << 1;
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits_remaining =
                   descriptor_bits.
                   super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   .bits_remaining - 1;
              if (descriptor_bits.
                  super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  .bits_remaining == 0) {
                BitField::
                DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                ::WriteBitsImplementation(&descriptor_bits);
              }
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits = descriptor_bits.
                      super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                      .bits * 2 + 1;
              descriptor_bits.
              super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
              .bits_remaining =
                   descriptor_bits.
                   super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                   .bits_remaining - 1;
              std::ostream::put((char)(output->
                                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                      ).output);
              std::ostream::put((char)(output->
                                      super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                      ).output);
            }
            std::ostream::put((char)(output->
                                    super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                    ).output);
          }
        }
        pCVar5 = pCVar5 + 3;
      } while (pCVar5 != descriptor_bits.
                         super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                         .output + total_matches * 3);
    }
    if (descriptor_bits.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits_remaining == 0) {
      BitField::
      DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
      ::WriteBitsImplementation(&descriptor_bits);
    }
    descriptor_bits.
    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    .bits = descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits << 1;
    descriptor_bits.
    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    .bits_remaining =
         descriptor_bits.
         super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
         .bits_remaining - 1;
    if (descriptor_bits.
        super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        .bits_remaining == 0) {
      BitField::
      DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
      ::WriteBitsImplementation(&descriptor_bits);
    }
    descriptor_bits.
    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    .bits = descriptor_bits.
            super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            .bits * 2 + 1;
    descriptor_bits.
    super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    .bits_remaining =
         descriptor_bits.
         super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
         .bits_remaining - 1;
    std::ostream::put((char)(output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    std::ostream::put((char)(output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    std::ostream::put((char)(output->
                            super_OutputCommon<std::basic_ofstream<char,_std::char_traits<char>_>,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                            ).output);
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::~DescriptorFieldWriter(&descriptor_bits);
  }
  if (descriptor_bits.
      super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
      .output != (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)0x0) {
    free(descriptor_bits.
         super_WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
         .output);
  }
  return iVar4 != 0;
}

Assistant:

bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x100 + 8, 0x2000, nullptr, 1 + 8, GetMatchCost, data, 1, data_size, &matches, &total_matches, nullptr))
					return false;

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);

				// Produce Kosinski+-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						descriptor_bits.Push(1);
						output.Write(data[match->destination]);
					}
					else
					{
						const std::size_t distance = match->destination - match->source;
						const std::size_t length = match->length;

						if (length >= 2 && length <= 5 && distance <= 0x100)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(0);
							output.Write(-distance & 0xFF);
							descriptor_bits.Push(!!((length - 2) & 2));
							descriptor_bits.Push(!!((length - 2) & 1));
						}
						else if (length >= 3 && length <= 9)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(1);
							output.Write(((-distance >> (8 - 3)) & 0xF8) | ((10 - length) & 7));
							output.Write(-distance & 0xFF);
						}
						else //if (length >= 10)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(1);
							output.Write((-distance >> (8 - 3)) & 0xF8);
							output.Write(-distance & 0xFF);
							output.Write(length - 9);
						}
					}
				}

				// Add the terminator match.
				descriptor_bits.Push(0);
				descriptor_bits.Push(1);
				output.Write(0xF0);
				output.Write(0x00);
				output.Write(0x00);

				return true;
			}